

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O1

LevenshteinDFA *
la::LevenshteinDFA::SubsetConstruct(LevenshteinDFA *__return_storage_ptr__,LevenshteinNFA *nfa)

{
  list<int,_std::allocator<int>_> *plVar1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  undefined1 uVar4;
  int iVar5;
  mapped_type mVar6;
  pair<int,_char> pVar7;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var8;
  pair<int,_char> pVar9;
  LevenshteinNFA *nfa_00;
  uint uVar10;
  _List_node_base *p_Var11;
  _Node *p_Var12;
  mapped_type *pmVar13;
  _List_node_base *p_Var14;
  __node_base_ptr p_Var15;
  mapped_type *pmVar16;
  ulong uVar17;
  size_t *psVar18;
  _List_node_base *p_Var19;
  _Fwd_list_node_base *p_Var20;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var21;
  ulong uVar22;
  long lVar23;
  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
  vec_tmp;
  list<int,_std::allocator<int>_> aState;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  unmarkedStates;
  list<int,_std::allocator<int>_> first;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  markedStates;
  list<int,_std::allocator<int>_> next;
  map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  dfaStateNum;
  list<int,_std::allocator<int>_> nfaInitial;
  int local_17c;
  pair<std::pair<int,_char>,_int> *local_178;
  iterator iStack_170;
  pair<std::pair<int,_char>,_int> *local_168;
  LevenshteinDFA *local_158;
  list<char,_std::allocator<char>_> *local_150;
  list<int,_std::allocator<int>_> local_148;
  uint local_12c;
  pair<std::pair<int,_char>,_int> local_128 [2];
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_110;
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_108;
  list<int,_std::allocator<int>_> *local_f0;
  LevenshteinNFA *local_e8;
  _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
  *local_e0;
  list<int,_std::allocator<int>_> local_d8;
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_a8;
  _Rb_tree_node_base local_a0;
  size_t local_80;
  _Rb_tree<std::__cxx11::list<int,_std::allocator<int>_>,_std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  local_78;
  list<int,_std::allocator<int>_> local_48;
  
  __return_storage_ptr__->_start = START;
  plVar1 = &__return_storage_ptr__->_finalStates;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)plVar1;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  ._M_size = 0;
  p_Var2 = &(__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = &(__return_storage_ptr__->_defaultTrans)._M_h;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_buckets =
       &(__return_storage_ptr__->_defaultTrans)._M_h._M_single_bucket;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_element_count = 0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_150 = &__return_storage_ptr__->_uniqueChars;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)local_150;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)local_150;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node._M_size = 0;
  local_c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
  local_c0._M_impl._M_node._M_size = 0;
  local_108._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_108;
  local_108._M_impl._M_node._M_size = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)&local_48;
  local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_158 = __return_storage_ptr__;
  local_108._M_impl._M_node.super__List_node_base._M_prev =
       local_108._M_impl._M_node.super__List_node_base._M_next;
  local_c0._M_impl._M_node.super__List_node_base._M_prev =
       local_c0._M_impl._M_node.super__List_node_base._M_next;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
       = local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next;
  p_Var11 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var11[1]._M_next = nfa->_initialState;
  std::__detail::_List_node_base::_M_hook(p_Var11);
  local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 1;
  EpsilonClosure(&local_d8,nfa,&local_48);
  p_Var12 = std::__cxx11::
            list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
            ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                      ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                        *)&local_108,&local_d8);
  std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
  local_108._M_impl._M_node._M_size = local_108._M_impl._M_node._M_size + 1;
  pmVar13 = std::
            map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
            ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          *)&local_78,&local_d8);
  *pmVar13 = 0;
  local_f0 = plVar1;
  if (local_108._M_impl._M_node._M_size != 0) {
    local_e0 = (_Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                *)&local_158->_transTable;
    local_17c = 1;
    local_e8 = nfa;
    do {
      std::__cxx11::list<int,_std::allocator<int>_>::list
                (&local_148,
                 (list<int,_std::allocator<int>_> *)
                 (local_108._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::
      list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
      ::_M_erase((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                  *)&local_108,(iterator)local_108._M_impl._M_node.super__List_node_base._M_next);
      p_Var12 = std::__cxx11::
                list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                          ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                            *)&local_c0,&local_148);
      std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
      local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
      for (p_Var11 = local_148.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_next; p_Var11 != (_List_node_base *)&local_148;
          p_Var11 = (((_List_base<int,_std::allocator<int>_> *)&p_Var11->_M_next)->_M_impl)._M_node.
                    super__List_node_base._M_next) {
        for (p_Var19 = (nfa->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl.
                       _M_node.super__List_node_base._M_next;
            p_Var19 != (_List_node_base *)&nfa->_finalStates; p_Var19 = p_Var19->_M_next) {
          if (*(int *)&p_Var11[1]._M_next == *(int *)&p_Var19[1]._M_next) {
            pmVar13 = std::
                      map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                    *)&local_78,&local_148);
            p_Var14 = (_List_node_base *)operator_new(0x18);
            *(mapped_type *)&p_Var14[1]._M_next = *pmVar13;
            std::__detail::_List_node_base::_M_hook(p_Var14);
            psVar3 = &(local_158->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node._M_size;
            *psVar3 = *psVar3 + 1;
          }
        }
      }
      local_178 = (pair<std::pair<int,_char>,_int> *)0x0;
      iStack_170._M_current = (pair<std::pair<int,_char>,_int> *)0x0;
      local_168 = (pair<std::pair<int,_char>,_int> *)0x0;
      p_Var20 = (local_e8->_inputs).super__Fwd_list_base<char,_std::allocator<char>_>._M_impl.
                _M_head._M_next;
      if (p_Var20 == (_Fwd_list_node_base *)0x0) {
        uVar10 = 0;
      }
      else {
        local_12c = 0;
        do {
          nfa_00 = local_e8;
          LevenshteinNFA::Move
                    ((list<int,_std::allocator<int>_> *)local_128,local_e8,&local_148,
                     *(char *)&p_Var20[1]._M_next);
          EpsilonClosure((list<int,_std::allocator<int>_> *)&local_a8,nfa_00,
                         (list<int,_std::allocator<int>_> *)local_128);
          pVar9 = local_128[0].first;
          while (pVar9 != (pair<int,_char>)local_128) {
            pVar7 = *(pair<int,_char> *)pVar9;
            operator_delete((void *)pVar9,0x18);
            pVar9 = pVar7;
          }
          uVar10 = local_12c;
          p_Var21 = local_a8;
          if (local_a8 !=
              (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&local_a8) {
            for (p_Var11 = local_108._M_impl._M_node.super__List_node_base._M_next;
                p_Var11 != (_List_node_base *)&local_108; p_Var11 = p_Var11->_M_next) {
              if ((_Base_ptr)p_Var11[2]._M_next == local_a0._M_parent) {
                p_Var19 = p_Var11 + 1;
                p_Var14 = p_Var19;
                p_Var21 = (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_a8;
                do {
                  p_Var21 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              **)&p_Var21->_M_impl;
                  p_Var14 = p_Var14->_M_next;
                  if ((p_Var14 == p_Var19) ||
                     (p_Var21 ==
                      (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&local_a8)) break;
                } while (*(int *)&p_Var14[1]._M_next ==
                         *(int *)&(p_Var21->_M_impl).super__Rb_tree_header._M_header._M_parent);
                if (p_Var14 == p_Var19 &&
                    p_Var21 ==
                    (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&local_a8) break;
              }
            }
            p_Var19 = local_c0._M_impl._M_node.super__List_node_base._M_next;
            if (p_Var11 == (_List_node_base *)&local_108) {
              for (; p_Var19 != (_List_node_base *)&local_c0;
                  p_Var19 = (((_List_impl *)&p_Var19->_M_next)->_M_node).super__List_node_base.
                            _M_next) {
                if (*(_Base_ptr *)(p_Var19 + 2) == local_a0._M_parent) {
                  psVar3 = (size_t *)(p_Var19 + 1);
                  psVar18 = psVar3;
                  p_Var21 = (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_a8;
                  do {
                    p_Var21 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                **)&p_Var21->_M_impl;
                    psVar18 = (size_t *)*psVar18;
                    if ((psVar18 == psVar3) ||
                       (p_Var21 ==
                        (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_a8)) break;
                  } while (*(int *)(psVar18 + 2) ==
                           *(int *)&(p_Var21->_M_impl).super__Rb_tree_header._M_header._M_parent);
                  if (psVar18 == psVar3 &&
                      p_Var21 ==
                      (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&local_a8) break;
                }
              }
              if (p_Var19 == (_List_node_base *)&local_c0) {
                p_Var12 = std::__cxx11::
                          list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                          ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                                    ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                                      *)&local_108,(list<int,_std::allocator<int>_> *)&local_a8);
                std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
                local_108._M_impl._M_node._M_size = local_108._M_impl._M_node._M_size + 1;
                local_128[0].first.first = local_17c;
                std::
                _Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                ::_M_emplace_unique<std::__cxx11::list<int,std::allocator<int>>&,int>
                          ((_Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                            *)&local_78,(list<int,_std::allocator<int>_> *)&local_a8,
                           (int *)local_128);
                local_17c = local_17c + 1;
              }
            }
            if ((*(byte *)&p_Var20[1]._M_next | 2) == 0x7e) {
              pmVar13 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_78,&local_148);
              uVar22 = (ulong)*pmVar13;
              p_Var15 = std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  (local_110,
                                   uVar22 % (local_158->_defaultTrans)._M_h._M_bucket_count,pmVar13,
                                   uVar22);
              if ((p_Var15 == (__node_base_ptr)0x0) ||
                 (uVar10 = local_12c, p_Var21 = local_a8, p_Var15->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                pmVar13 = std::
                          map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                        *)&local_78,&local_148);
                pmVar16 = std::
                          map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                        *)&local_78,(key_type *)&local_a8);
                std::
                _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<int&,int&>
                          ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)local_110,pmVar13,pmVar16);
                local_12c = (uint)CONCAT71((int7)(uVar22 >> 8),1);
                uVar10 = local_12c;
                p_Var21 = local_a8;
                if (iStack_170._M_current != local_178) {
                  lVar23 = 0;
                  uVar22 = 0;
                  do {
                    iVar5 = *(int *)((long)&(local_178->first).first + lVar23);
                    pmVar13 = std::
                              map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                            *)&local_78,&local_148);
                    if ((iVar5 != *pmVar13) ||
                       (iVar5 = *(int *)((long)&local_178->second + lVar23),
                       pmVar13 = std::
                                 map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                               *)&local_78,(key_type *)&local_a8), iVar5 != *pmVar13
                       )) {
                      local_128[0].first =
                           *(pair<int,_char> *)((long)&(local_178->first).first + lVar23);
                      local_128[0].second = *(mapped_type *)((long)&local_178->second + lVar23);
                      std::
                      _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                      ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>(local_e0,local_128);
                    }
                    uVar22 = uVar22 + 1;
                    uVar17 = ((long)iStack_170._M_current - (long)local_178 >> 2) *
                             -0x5555555555555555;
                    lVar23 = lVar23 + 0xc;
                    uVar10 = local_12c;
                    p_Var21 = local_a8;
                  } while (uVar22 <= uVar17 && uVar17 - uVar22 != 0);
                }
              }
            }
            else {
              p_Var11 = (_List_node_base *)operator_new(0x18);
              *(undefined1 *)&p_Var11[1]._M_next = *(undefined1 *)&p_Var20[1]._M_next;
              std::__detail::_List_node_base::_M_hook(p_Var11);
              psVar3 = &(local_158->_uniqueChars).super__List_base<char,_std::allocator<char>_>.
                        _M_impl._M_node._M_size;
              *psVar3 = *psVar3 + 1;
              pmVar13 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_78,&local_148);
              mVar6 = *pmVar13;
              uVar4 = *(undefined1 *)&p_Var20[1]._M_next;
              pmVar13 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_78,(key_type *)&local_a8);
              local_128[0].first.second = uVar4;
              local_128[0].first.first = mVar6;
              local_128[0].first._5_3_ = 0;
              local_128[0].second = *pmVar13;
              if (iStack_170._M_current == local_168) {
                std::
                vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
                ::_M_realloc_insert<std::pair<std::pair<int,char>,int>>
                          ((vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
                            *)&local_178,iStack_170,local_128);
                uVar10 = local_12c;
                p_Var21 = local_a8;
              }
              else {
                (iStack_170._M_current)->second = local_128[0].second;
                (iStack_170._M_current)->first = local_128[0].first;
                iStack_170._M_current = iStack_170._M_current + 1;
                uVar10 = local_12c;
                p_Var21 = local_a8;
              }
            }
          }
          while (local_12c = uVar10,
                p_Var21 !=
                (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)&local_a8) {
            p_Var8 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       **)&p_Var21->_M_impl;
            operator_delete(p_Var21,0x18);
            uVar10 = local_12c;
            p_Var21 = p_Var8;
          }
          p_Var20 = p_Var20->_M_next;
        } while (p_Var20 != (_Fwd_list_node_base *)0x0);
      }
      if ((uVar10 & 1) == 0) {
        local_a0._M_color = _S_red;
        local_a0._M_parent = (_Base_ptr)0x0;
        local_a0._M_left = &local_a0;
        local_80 = 0;
        local_a0._M_right = local_a0._M_left;
        if (iStack_170._M_current != local_178) {
          lVar23 = 8;
          uVar22 = 0;
          do {
            pmVar13 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_a8,(key_type *)((long)&(local_178->first).first + lVar23)
                                );
            *pmVar13 = *pmVar13 + 1;
            uVar22 = uVar22 + 1;
            uVar17 = ((long)iStack_170._M_current - (long)local_178 >> 2) * -0x5555555555555555;
            lVar23 = lVar23 + 0xc;
          } while (uVar22 <= uVar17 && uVar17 - uVar22 != 0);
        }
        if (iStack_170._M_current != local_178) {
          lVar23 = 8;
          uVar22 = 0;
          do {
            pmVar13 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_a8,(key_type *)((long)&(local_178->first).first + lVar23)
                                );
            if (*pmVar13 == 1) {
              local_128[0].first = *(pair<int,_char> *)((long)local_178 + lVar23 + -8);
              local_128[0].second = *(mapped_type *)((long)&(local_178->first).first + lVar23);
              std::
              _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
              ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>(local_e0,local_128);
            }
            else {
              std::
              _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<int&,int&>
                        ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)local_110,(long)local_178 + lVar23 + -8,
                         (long)&(local_178->first).first + lVar23);
            }
            uVar22 = uVar22 + 1;
            uVar17 = ((long)iStack_170._M_current - (long)local_178 >> 2) * -0x5555555555555555;
            lVar23 = lVar23 + 0xc;
          } while (uVar22 <= uVar17 && uVar17 - uVar22 != 0);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&local_a8);
      }
      p_Var11 = local_148.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next;
      if (local_178 != (pair<std::pair<int,_char>,_int> *)0x0) {
        operator_delete(local_178,(long)local_168 - (long)local_178);
        p_Var11 = local_148.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next;
      }
      while (p_Var11 != (_List_node_base *)&local_148) {
        p_Var19 = p_Var11->_M_next;
        operator_delete(p_Var11,0x18);
        p_Var11 = p_Var19;
      }
    } while (local_108._M_impl._M_node._M_size != 0);
  }
  plVar1 = local_f0;
  std::__cxx11::list<int,_std::allocator<int>_>::sort(local_f0);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(plVar1);
  std::__cxx11::list<char,_std::allocator<char>_>::sort(local_150);
  std::__cxx11::list<char,_std::allocator<char>_>::unique(local_150);
  while (p_Var11 = local_48.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next,
        local_d8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
        _M_next != (_List_node_base *)&local_d8) {
    p_Var11 = (((_List_base<int,_std::allocator<int>_> *)
               &(local_d8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
              _M_next;
    operator_delete(local_d8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    local_d8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var11;
  }
  while (p_Var11 != (_List_node_base *)&local_48) {
    p_Var19 = (((_List_base<int,_std::allocator<int>_> *)&p_Var11->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(p_Var11,0x18);
    p_Var11 = p_Var19;
  }
  std::
  _Rb_tree<std::__cxx11::list<int,_std::allocator<int>_>,_std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  ::~_Rb_tree(&local_78);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&local_108);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&local_c0);
  return local_158;
}

Assistant:

LevenshteinDFA LevenshteinDFA::SubsetConstruct(const LevenshteinNFA &nfa)
    {
        LevenshteinDFA dfa{};
        int num = 0;

        std::list<std::list<int>> markedStates;
        std::list<std::list<int>> unmarkedStates;

        std::map<std::list<int>, int> dfaStateNum;

        std::list<int> nfaInitial;
        nfaInitial.emplace_back(nfa._initialState);

        std::list<int> first = EpsilonClosure(nfa, nfaInitial);
        unmarkedStates.emplace_back(first);

        //the initial dfa state
        int dfaInitial = num++;
        dfaStateNum[first] = dfaInitial;

        while (unmarkedStates.size() != 0)
        {
            bool tag=false;
            std::list<int> aState = unmarkedStates.front();
            unmarkedStates.pop_front();

            markedStates.emplace_back(aState);

            //Kinda killer, should redo
            for (std::list<int>::iterator it = aState.begin(); it != aState.end();++it)
            {
                for (auto it2 = nfa._finalStates.begin(); it2 != nfa._finalStates.end();++it2)
                {
                    if (*it == *it2)
                    {
                        dfa._finalStates.emplace_back(dfaStateNum[aState]);
                    }
                }
            }
            std::vector<std::pair<std::pair<int,char>,int>> vec_tmp;
//            for each (char c in nfa->inputs)
            for  (const char &c : nfa._inputs)
            {
                std::list<int> next = EpsilonClosure(nfa, nfa.Move(aState, c));
                if (next.empty()) continue;
                if (std::find(unmarkedStates.begin(), unmarkedStates.end(), next) == unmarkedStates.end() &&
                    std::find(markedStates.begin(), markedStates.end(), next) == markedStates.end())
                {
                    unmarkedStates.emplace_back(next);
                    dfaStateNum.emplace(next, num++);
                }
                if (c != (char)LevenshteinNFA::Constants::Insertion && c != (char)LevenshteinNFA::Constants::Deletion)
                {
                    dfa._uniqueChars.emplace_back(c);
                    std::pair<int, char> transition = std::make_pair(dfaStateNum[aState],c);
                    vec_tmp.push_back(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                   // dfa->transTable->insert(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                }
                else
                {
                    auto it = dfa._defaultTrans.find(dfaStateNum[aState]);
                    //TODO 数字 ascli值太大
                    if (it == dfa._defaultTrans.end())
                    {
                        dfa._defaultTrans.emplace(dfaStateNum[aState], dfaStateNum[next]);
                        tag = true;
                        for(int i=0;i<vec_tmp.size();i++){
                            if(!(vec_tmp[i].first.first == dfaStateNum[aState]&& vec_tmp[i].second == dfaStateNum[next])){
                                dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                            }

                        }
                    }
                }
            }
            if(!tag){
                std::map<int,int> map_tmp;
                for(int i=0;i<vec_tmp.size();i++){
                        map_tmp[vec_tmp[i].second]++;
                }
                for(int i=0;i<vec_tmp.size();i++){
                    //printf("%d %d %d\n",vec_tmp[i].second,map_tmp[vec_tmp[i].second],vec_tmp.size());
                    if(map_tmp[vec_tmp[i].second]==1){
                        dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                    }
                    else{
                        dfa._defaultTrans.emplace(vec_tmp[i].first.first,vec_tmp[i].second);
                    }
                }
            }
        }
        dfa._finalStates.sort();
        dfa._finalStates.unique();
        dfa._uniqueChars.sort();
        dfa._uniqueChars.unique();
        return dfa;
    }